

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olf.h
# Opt level: O3

void __thiscall OLF<4U>::Init(OLF<4U> *this,Data<4U> *from,Data<4U> *to)

{
  uint uVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type mVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  Stream<4U> stream;
  key_type local_28;
  
  auVar7 = in_ZMM0._0_16_;
  local_28.str._4_4_ = *(undefined4 *)to->str;
  local_28.str._0_4_ = *(undefined4 *)from->str;
  uVar1 = Hash::BOBHash32(local_28.str,8,0);
  auVar7 = vcvtusi2sd_avx512f(auVar7,uVar1);
  if (auVar7._0_8_ / 4294967295.0 < this->epsilon) {
    iVar2 = std::
            _Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->sp)._M_h,&local_28);
    if (iVar2.super__Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true>._M_cur ==
        (__node_type *)0x0) {
      pmVar3 = std::__detail::
               _Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->sp,&local_28);
      *pmVar3 = 1;
      iVar4 = std::
              _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->mp)._M_h,from);
      pmVar5 = std::__detail::
               _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->mp,from);
      mVar6 = *pmVar5 + 1;
      if (iVar4.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
          (__node_type *)0x0) {
        mVar6 = 1;
      }
      *pmVar5 = mVar6;
    }
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& from, const Data<DATA_LEN>& to) {
		uint Max = 0xffffffff;
		Stream<DATA_LEN> stream(from, to);
		if (stream.Hash() / (double)Max < epsilon && sp.find(stream) == sp.end()) {
			sp[stream] = 1;
			if (mp.find(from) == mp.end())
				mp[from] = 1;
			else
				mp[from] += 1;
		}
	}